

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r)

{
  bool bVar1;
  
  bVar1 = ((r->y).n[0] & 1) != 0;
  if (bVar1) {
    secp256k1_fe_impl_negate_unchecked(&r->y,&r->y,1);
  }
  return (uint)bVar1;
}

Assistant:

static int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r) {
    int y_parity = 0;
    VERIFY_CHECK(!secp256k1_ge_is_infinity(r));

    if (secp256k1_fe_is_odd(&r->y)) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
        y_parity = 1;
    }
    return y_parity;
}